

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O2

uint64_t helper_paired_cmpxchg64_be_parallel_aarch64
                   (CPUARMState_conflict *env,uint64_t addr,uint64_t new_lo,uint64_t new_hi)

{
  uint64_t uVar1;
  Int128 *addr_00;
  undefined1 cmpv [16];
  undefined1 newv [16];
  undefined8 in_RAX;
  Int128 *pIVar2;
  uint64_t extraout_RDX;
  undefined8 unaff_RBX;
  undefined8 unaff_retaddr;
  
  cmpv._4_4_ = 0;
  cmpv._0_4_ = *(byte *)((long)&env->hflags + 3) & 0xf | 0x4b0;
  uVar1 = env->exclusive_val;
  addr_00 = (Int128 *)env->exclusive_high;
  cmpv._8_8_ = unaff_retaddr;
  newv._8_8_ = unaff_RBX;
  newv._0_8_ = in_RAX;
  pIVar2 = helper_atomic_cmpxchgo_be_mmu_aarch64
                     ((Int128 *)env,(CPUArchState_conflict1 *)addr,(target_ulong)addr_00,
                      (Int128)cmpv,(Int128)newv,(TCGMemOpIdx)uVar1,new_hi);
  return (ulong)(pIVar2 != addr_00 || extraout_RDX != uVar1);
}

Assistant:

uint64_t HELPER(paired_cmpxchg64_be_parallel)(CPUARMState *env, uint64_t addr,
                                              uint64_t new_lo, uint64_t new_hi)
{
    Int128 oldv, cmpv, newv;
    uintptr_t ra = GETPC();
    bool success;
    int mem_idx;
    TCGMemOpIdx oi;

    assert(HAVE_CMPXCHG128);

    mem_idx = cpu_mmu_index(env, false);
    oi = make_memop_idx(MO_BEQ | MO_ALIGN_16, mem_idx);

    /*
     * High and low need to be switched here because this is not actually a
     * 128bit store but two doublewords stored consecutively
     */
    cmpv = int128_make128(env->exclusive_high, env->exclusive_val);
    newv = int128_make128(new_hi, new_lo);
    oldv = helper_atomic_cmpxchgo_be_mmu(env, addr, cmpv, newv, oi, ra);

    success = int128_eq(oldv, cmpv);
    return !success;
}